

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::uploadTexture
               (CallLogWrapper *glLog,LayeredImage *src,deUint32 textureBufGL)

{
  deUint32 dVar1;
  deUint32 dVar2;
  TextureType TVar3;
  deBool dVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  int depth;
  TransferFormat *pTVar8;
  TextureFormat *pTVar9;
  void *pvVar10;
  ConstPixelBufferAccess local_110;
  deUint32 local_e4;
  deUint32 textureTarget;
  CubeFace local_b8;
  CubeFace local_b4;
  CubeFace face;
  int faceI;
  ConstPixelBufferAccess local_88;
  GLint local_60;
  int local_5c;
  int unpackAlignment;
  int pixelSize;
  IVec3 *imageSize;
  TransferFormat local_48;
  TransferFormat transferFormat;
  deUint32 internalFormat;
  deUint32 textureBufGL_local;
  LayeredImage *src_local;
  CallLogWrapper *glLog_local;
  
  pTVar8 = (TransferFormat *)LayeredImage::getFormat(src);
  transferFormat = *pTVar8;
  dVar2 = glu::getInternalFormat((TextureFormat)transferFormat);
  pTVar9 = LayeredImage::getFormat(src);
  imageSize = *(IVec3 **)pTVar9;
  local_48 = glu::getTransferFormat((TextureFormat)imageSize);
  _unpackAlignment = LayeredImage::getSize(src);
  TVar3 = LayeredImage::getImageType(src);
  setTextureStorage(glLog,TVar3,dVar2,_unpackAlignment,textureBufGL);
  pTVar9 = LayeredImage::getFormat(src);
  local_5c = tcu::TextureFormat::getPixelSize(pTVar9);
  dVar4 = ::deIsPowerOfTwo32(local_5c);
  if (dVar4 == 0) {
    local_60 = 1;
  }
  else {
    local_60 = 8;
  }
  glu::CallLogWrapper::glPixelStorei(glLog,0xcf5,local_60);
  TVar3 = LayeredImage::getImageType(src);
  if (TVar3 == TEXTURETYPE_BUFFER) {
    glu::CallLogWrapper::glBindBuffer(glLog,0x8c2a,textureBufGL);
    pTVar9 = LayeredImage::getFormat(src);
    iVar5 = tcu::TextureFormat::getPixelSize(pTVar9);
    iVar6 = tcu::Vector<int,_3>::x(_unpackAlignment);
    LayeredImage::getAccess(&local_88,src);
    pvVar10 = tcu::ConstPixelBufferAccess::getDataPtr(&local_88);
    glu::CallLogWrapper::glBufferData(glLog,0x8c2a,(long)(iVar5 * iVar6),pvVar10,0x88e4);
  }
  else {
    TVar3 = LayeredImage::getImageType(src);
    if (TVar3 == TEXTURETYPE_2D) {
      iVar5 = tcu::Vector<int,_3>::x(_unpackAlignment);
      iVar6 = tcu::Vector<int,_3>::y(_unpackAlignment);
      dVar2 = local_48.format;
      dVar1 = local_48.dataType;
      LayeredImage::getAccess((ConstPixelBufferAccess *)&face,src);
      pvVar10 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)&face);
      glu::CallLogWrapper::glTexSubImage2D(glLog,0xde1,0,0,0,iVar5,iVar6,dVar2,dVar1,pvVar10);
    }
    else {
      TVar3 = LayeredImage::getImageType(src);
      if (TVar3 == TEXTURETYPE_CUBE) {
        for (local_b4 = CUBEFACE_NEGATIVE_X; (int)local_b4 < 6;
            local_b4 = local_b4 + CUBEFACE_POSITIVE_X) {
          local_b8 = local_b4;
          dVar7 = cubeFaceToGLFace(local_b4);
          iVar5 = tcu::Vector<int,_3>::x(_unpackAlignment);
          iVar6 = tcu::Vector<int,_3>::y(_unpackAlignment);
          dVar2 = local_48.format;
          dVar1 = local_48.dataType;
          LayeredImage::getCubeFaceAccess
                    ((ConstPixelBufferAccess *)&stack0xffffffffffffff20,src,local_b8);
          pvVar10 = tcu::ConstPixelBufferAccess::getDataPtr
                              ((ConstPixelBufferAccess *)&stack0xffffffffffffff20);
          glu::CallLogWrapper::glTexSubImage2D(glLog,dVar7,0,0,0,iVar5,iVar6,dVar2,dVar1,pvVar10);
        }
      }
      else {
        TVar3 = LayeredImage::getImageType(src);
        dVar7 = Functional::getGLTextureTarget(TVar3);
        local_e4 = dVar7;
        iVar5 = tcu::Vector<int,_3>::x(_unpackAlignment);
        iVar6 = tcu::Vector<int,_3>::y(_unpackAlignment);
        depth = tcu::Vector<int,_3>::z(_unpackAlignment);
        dVar2 = local_48.format;
        dVar1 = local_48.dataType;
        LayeredImage::getAccess(&local_110,src);
        pvVar10 = tcu::ConstPixelBufferAccess::getDataPtr(&local_110);
        glu::CallLogWrapper::glTexSubImage3D
                  (glLog,dVar7,0,0,0,0,iVar5,iVar6,depth,dVar2,dVar1,pvVar10);
      }
    }
  }
  return;
}

Assistant:

static void uploadTexture (glu::CallLogWrapper& glLog, const LayeredImage& src, deUint32 textureBufGL)
{
	const deUint32				internalFormat	= glu::getInternalFormat(src.getFormat());
	const glu::TransferFormat	transferFormat	= glu::getTransferFormat(src.getFormat());
	const IVec3&				imageSize		= src.getSize();

	setTextureStorage(glLog, src.getImageType(), internalFormat, imageSize, textureBufGL);

	{
		const int	pixelSize = src.getFormat().getPixelSize();
		int			unpackAlignment;

		if (deIsPowerOfTwo32(pixelSize))
			unpackAlignment = 8;
		else
			unpackAlignment = 1;

		glLog.glPixelStorei(GL_UNPACK_ALIGNMENT, unpackAlignment);
	}

	if (src.getImageType() == TEXTURETYPE_BUFFER)
	{
		glLog.glBindBuffer(GL_TEXTURE_BUFFER, textureBufGL);
		glLog.glBufferData(GL_TEXTURE_BUFFER, src.getFormat().getPixelSize() * imageSize.x(), src.getAccess().getDataPtr(), GL_STATIC_DRAW);
	}
	else if (src.getImageType() == TEXTURETYPE_2D)
		glLog.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageSize.x(), imageSize.y(), transferFormat.format, transferFormat.dataType, src.getAccess().getDataPtr());
	else if (src.getImageType() == TEXTURETYPE_CUBE)
	{
		for (int faceI = 0; faceI < tcu::CUBEFACE_LAST; faceI++)
		{
			const tcu::CubeFace face = (tcu::CubeFace)faceI;
			glLog.glTexSubImage2D(cubeFaceToGLFace(face), 0, 0, 0, imageSize.x(), imageSize.y(), transferFormat.format, transferFormat.dataType, src.getCubeFaceAccess(face).getDataPtr());
		}
	}
	else
	{
		DE_ASSERT(src.getImageType() == TEXTURETYPE_3D || src.getImageType() == TEXTURETYPE_2D_ARRAY);
		const deUint32 textureTarget = getGLTextureTarget(src.getImageType());
		glLog.glTexSubImage3D(textureTarget, 0, 0, 0, 0, imageSize.x(), imageSize.y(), imageSize.z(), transferFormat.format, transferFormat.dataType, src.getAccess().getDataPtr());
	}
}